

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varlist.cc
# Opt level: O1

VariableStruct * __thiscall VariableList::LookupCpp(VariableList *this,string *VarName)

{
  VariableStruct *pVVar1;
  __normal_iterator<ListOfVariables_*,_std::vector<ListOfVariables,_std::allocator<ListOfVariables>_>_>
  __tmp;
  pointer this_00;
  
  this_00 = (this->super_vector<ListOfVariables,_std::allocator<ListOfVariables>_>).
            super__Vector_base<ListOfVariables,_std::allocator<ListOfVariables>_>._M_impl.
            super__Vector_impl_data._M_finish;
  do {
    if (this_00 ==
        (this->super_vector<ListOfVariables,_std::allocator<ListOfVariables>_>).
        super__Vector_base<ListOfVariables,_std::allocator<ListOfVariables>_>._M_impl.
        super__Vector_impl_data._M_start) {
      return (VariableStruct *)0x0;
    }
    this_00 = this_00 + -1;
    pVVar1 = ListOfVariables::LookupCpp(this_00,VarName);
  } while (pVVar1 == (VariableStruct *)0x0);
  return pVVar1;
}

Assistant:

VariableStruct *VariableList::LookupCpp
(
	const std::string &VarName	/**< Variable name to look up */
)
{
	VariableStruct *VarTable;

	for (reverse_iterator loop = rbegin();
		loop != rend(); loop++)
	{
		VarTable = (*loop).LookupCpp(VarName);

		if (VarTable != 0)
		{
			break;
		}
	}

	return VarTable;
}